

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O0

void arrayContentToJson(QCborContainerPrivate *a,QByteArray *json,int indent,bool compact)

{
  long lVar1;
  bool bVar2;
  QCborValue *pQVar3;
  undefined1 in_CL;
  int in_EDX;
  QCborContainerPrivate *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  QByteArray indentString;
  undefined7 in_stack_ffffffffffffff98;
  char in_stack_ffffffffffffff9f;
  QCborValue *in_stack_ffffffffffffffa0;
  QByteArray *in_stack_ffffffffffffffa8;
  QCborValue *pQVar4;
  undefined3 in_stack_ffffffffffffffb0;
  uint uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = CONCAT13(in_CL,in_stack_ffffffffffffffb0) & 0x1ffffff;
  if ((in_RDI != (QCborValue *)0x0) &&
     (bVar2 = QList<QtCbor::Element>::empty((QList<QtCbor::Element> *)0x1be3ae), !bVar2)) {
    QByteArray::QByteArray
              (in_stack_ffffffffffffffa8,(qsizetype)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff9f);
    pQVar4 = (QCborValue *)0x0;
    while( true ) {
      QByteArray::operator+=
                ((QByteArray *)in_stack_ffffffffffffffa0,
                 (QByteArray *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      QCborContainerPrivate::valueAt(in_RSI,CONCAT44(in_EDX,uVar5));
      valueContentToJson(in_RDI,(QByteArray *)in_RSI,in_EDX,SUB41(uVar5 >> 0x18,0));
      QCborValue::~QCborValue(in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffa0 = (QCborValue *)((long)&pQVar4->n + 1);
      pQVar4 = in_stack_ffffffffffffffa0;
      pQVar3 = (QCborValue *)QList<QtCbor::Element>::size((QList<QtCbor::Element> *)&in_RDI[1].t);
      if (in_stack_ffffffffffffffa0 == pQVar3) break;
      QByteArray::operator+=
                ((QByteArray *)in_stack_ffffffffffffffa0,
                 (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    }
    if ((uVar5 & 0x1000000) == 0) {
      QByteArray::operator+=((QByteArray *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
    }
    QByteArray::~QByteArray((QByteArray *)0x1be4c2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void arrayContentToJson(const QCborContainerPrivate *a, QByteArray &json, int indent, bool compact)
{
    if (!a || a->elements.empty())
        return;

    QByteArray indentString(4*indent, ' ');

    qsizetype i = 0;
    while (true) {
        json += indentString;
        valueContentToJson(a->valueAt(i), json, indent, compact);

        if (++i == a->elements.size()) {
            if (!compact)
                json += '\n';
            break;
        }

        json += compact ? "," : ",\n";
    }
}